

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  FILE *pFVar5;
  stack_st_X509 *certs;
  X509 *pXVar6;
  size_t sVar7;
  int *piVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  code *pcVar12;
  long lVar13;
  size_t sStack_1c0;
  ptls_openssl_verify_certificate_t verify_certificate;
  EVP_PKEY *local_198;
  addrinfo *local_190;
  undefined1 local_188 [16];
  size_t *local_178;
  undefined8 uStack_170;
  ptls_context_t ctx;
  ptls_save_ticket_t save_ticket;
  ptls_encrypt_ticket_t decrypt_ticket;
  ptls_encrypt_ticket_t encrypt_ticket;
  ptls_openssl_lookup_certificate_t lookup_certificate;
  sockaddr_storage sa;
  addrinfo hints;
  
  local_198 = (EVP_PKEY *)0x0;
  OPENSSL_init_crypto(2,0);
  OPENSSL_init_crypto(0xc,0);
  ENGINE_load_builtin_engines();
  ENGINE_register_all_ciphers();
  ENGINE_register_all_digests();
  ctx.encrypt_ticket = &encrypt_ticket;
  encrypt_ticket.cb = encrypt_ticket_cb;
  ctx.decrypt_ticket = &decrypt_ticket;
  decrypt_ticket.cb = decrypt_ticket_cb;
  ctx.save_ticket = &save_ticket;
  save_ticket.cb = save_ticket_cb;
  ctx.random_bytes = ptls_openssl_random_bytes;
  ctx.key_exchanges = ptls_openssl_key_exchanges;
  ctx.cipher_suites = ptls_openssl_cipher_suites;
  ctx.lookup_certificate = &lookup_certificate.super;
  ctx.verify_certificate = (ptls_verify_certificate_t *)0x0;
  ctx.ticket_lifetime = 0x15180;
  ctx.max_early_data_size = 0x2000;
  ctx.require_dhe_on_psk = 0;
  verify_certificate.super.cb =
       (_func_int_st_ptls_verify_certificate_t_ptr_ptls_t_ptr__func_int_void_ptr_ptls_iovec_t_ptls_iovec_t_ptr_ptr_void_ptr_ptr_ptls_iovec_t_ptr_size_t
        *)0x0;
  verify_certificate.cert_store = (X509_STORE *)0x0;
  local_178 = (size_t *)0x0;
  uStack_170 = 0;
  local_188._0_2_ = 0;
  local_188[2] = '\0';
  local_188[3] = '\0';
  local_188[4] = '\0';
  local_188[5] = '\0';
  local_188[6] = '\0';
  local_188[7] = '\0';
  local_188[8] = '\0';
  local_188[9] = '\0';
  local_188[10] = '\0';
  local_188[0xb] = '\0';
  local_188[0xc] = '\0';
  local_188[0xd] = '\0';
  local_188[0xe] = '\0';
  local_188[0xf] = '\0';
  ptls_openssl_init_lookup_certificate((ptls_openssl_lookup_certificate_t *)ctx.lookup_certificate);
  bVar2 = true;
  certs = (stack_st_X509 *)0x0;
  while( true ) {
    while( true ) {
      while( true ) {
        iVar3 = getopt(argc,argv,"c:k:es:vh");
        iVar4 = _optind;
        if (iVar3 != 0x73) break;
        session_file = _optarg;
      }
      if (iVar3 != 0x76) break;
      ptls_openssl_init_verify_certificate(&verify_certificate,(X509_STORE *)0x0);
    }
    if (iVar3 == -1) break;
    if (iVar3 == 0x6b) {
      pFVar5 = fopen(_optarg,"rb");
      if (pFVar5 == (FILE *)0x0) goto LAB_00103ceb;
      local_198 = PEM_read_PrivateKey(pFVar5,(EVP_PKEY **)0x0,(undefined1 *)0x0,(void *)0x0);
      fclose(pFVar5);
      if (local_198 == (EVP_PKEY *)0x0) {
        pcVar11 = "failed to load private key from file:%s\n";
LAB_00103d31:
        fprintf(_stderr,pcVar11,_optarg);
        return 1;
      }
    }
    else if (iVar3 == 0x65) {
      bVar2 = false;
    }
    else {
      if (iVar3 != 99) {
        usage(*argv);
        goto LAB_00103d42;
      }
      pFVar5 = fopen(_optarg,"rb");
      if (pFVar5 == (FILE *)0x0) {
LAB_00103ceb:
        pFVar5 = _stderr;
        pcVar11 = _optarg;
        piVar8 = __errno_location();
        pcVar9 = strerror(*piVar8);
        fprintf(pFVar5,"failed to open file:%s:%s\n",pcVar11,pcVar9);
        return 1;
      }
      certs = (stack_st_X509 *)OPENSSL_sk_new(0);
      while (pXVar6 = PEM_read_X509(pFVar5,(X509 **)0x0,(undefined1 *)0x0,(void *)0x0),
            pXVar6 != (X509 *)0x0) {
        OPENSSL_sk_push(certs);
      }
      fclose(pFVar5);
      iVar4 = OPENSSL_sk_num(certs);
      if (iVar4 == 0) {
        pcVar11 = "failed to load certificate chain from file:%s\n";
        goto LAB_00103d31;
      }
    }
  }
  lVar13 = (long)_optind;
  if (certs == (stack_st_X509 *)0x0 && local_198 == (EVP_PKEY *)0x0) {
    if (session_file != (char *)0x0) {
      sa._0_8_ = (long)
                 "Usage: %s [options] host port\n\nOptions:\n  -c certificate-file\n  -k key-file          specifies the credentials to be used for running the\n                       server. If omitted, the command runs as a client.\n  -s session-file      file to read/write the session ticket\n  -v                   verify peer using the default certificates\n  -h                   print this help\n\n"
                 + 0x17a;
      sa.__ss_padding[6] = '\0';
      sa.__ss_padding[7] = '\0';
      sa.__ss_padding[8] = '\0';
      sa.__ss_padding[9] = '\0';
      sa.__ss_padding[10] = '\0';
      sa.__ss_padding[0xb] = '\0';
      sa.__ss_padding[0xc] = '\0';
      sa.__ss_padding[0xd] = '\0';
      sa.__ss_padding[0xe] = '\0';
      sa.__ss_padding[0xf] = '\0';
      sa.__ss_padding[0x10] = '\0';
      sa.__ss_padding[0x11] = '\0';
      sa.__ss_padding[0x12] = '\0';
      sa.__ss_padding[0x13] = '\0';
      sa.__ss_padding[0x14] = '\0';
      sa.__ss_padding[0x15] = '\0';
      sa.__ss_padding[0x16] = '\0';
      sa.__ss_padding[0x17] = '\0';
      sa.__ss_padding[0x18] = '\0';
      sa.__ss_padding[0x19] = '\0';
      pFVar5 = fopen(session_file,"rb");
      if (pFVar5 != (FILE *)0x0) {
        while (iVar3 = ptls_buffer_reserve((ptls_buffer_t *)&sa,0x100), iVar3 == 0) {
          sVar7 = fread((void *)(sa._0_8_ + sa.__ss_padding._14_8_),1,0x100,pFVar5);
          if (sVar7 == 0) {
            fclose(pFVar5);
            local_188._0_2_ = sa.ss_family;
            local_188[2] = sa.__ss_padding[0];
            local_188[3] = sa.__ss_padding[1];
            local_188[4] = sa.__ss_padding[2];
            local_188[5] = sa.__ss_padding[3];
            local_188[6] = sa.__ss_padding[4];
            local_188[7] = sa.__ss_padding[5];
            local_188[8] = sa.__ss_padding[0xe];
            local_188[9] = sa.__ss_padding[0xf];
            local_188[10] = sa.__ss_padding[0x10];
            local_188[0xb] = sa.__ss_padding[0x11];
            local_188[0xc] = sa.__ss_padding[0x12];
            local_188[0xd] = sa.__ss_padding[0x13];
            local_188[0xe] = sa.__ss_padding[0x14];
            local_188[0xf] = sa.__ss_padding[0x15];
            break;
          }
          sa.__ss_padding._14_8_ = sa.__ss_padding._14_8_ + sVar7;
        }
      }
    }
    if (!bVar2) {
      local_178 = &main::max_early_data_size;
    }
LAB_00103bb1:
    if (verify_certificate.super.cb ==
        (_func_int_st_ptls_verify_certificate_t_ptr_ptls_t_ptr__func_int_void_ptr_ptls_iovec_t_ptls_iovec_t_ptr_ptr_void_ptr_ptr_ptls_iovec_t_ptr_size_t
         *)0x0) {
      ptls_openssl_init_verify_certificate(&verify_certificate,(X509_STORE *)0x0);
    }
    ctx.verify_certificate = &verify_certificate.super;
    if (argc - iVar4 == 2) {
      pcVar11 = argv[lVar13];
      pcVar9 = argv[lVar13 + 1];
      hints.ai_addrlen = 0;
      hints._20_4_ = 0;
      hints.ai_addr = (sockaddr *)0x0;
      hints.ai_canonname = (char *)0x0;
      hints.ai_next = (addrinfo *)0x0;
      hints.ai_socktype = 1;
      hints.ai_protocol = 6;
      hints.ai_flags = 0x421;
      hints.ai_family = 0;
      iVar4 = getaddrinfo(pcVar11,pcVar9,(addrinfo *)&hints,&local_190);
      pFVar5 = _stderr;
      if ((iVar4 == 0) && (local_190 != (addrinfo *)0x0)) {
        uVar1 = local_190->ai_addrlen;
        memcpy(&sa,local_190->ai_addr,(ulong)uVar1);
        freeaddrinfo(local_190);
        pcVar12 = run_client;
        if (certs != (stack_st_X509 *)0x0) {
          pcVar12 = run_server;
        }
        iVar4 = (*pcVar12)(&sa,uVar1,&ctx,local_188);
        return iVar4;
      }
      if (iVar4 == 0) {
        pcVar10 = "getaddrinfo returned NULL";
      }
      else {
        pcVar10 = gai_strerror(iVar4);
      }
      fprintf(pFVar5,"failed to resolve address:%s:%s:%s\n",pcVar11,pcVar9,pcVar10);
LAB_00103d42:
      exit(1);
    }
    pcVar11 = "missing host and port\n";
    sStack_1c0 = 0x16;
  }
  else {
    if ((certs == (stack_st_X509 *)0x0) || (local_198 == (EVP_PKEY *)0x0)) {
      pcVar11 = "-c and -k options must be used together\n";
      sStack_1c0 = 0x28;
      goto LAB_00103cdd;
    }
    if (session_file == (char *)0x0) {
      if (bVar2) {
        ptls_openssl_lookup_certificate_add_identity
                  (&lookup_certificate,"example.com",(EVP_PKEY *)local_198,certs);
        OPENSSL_sk_free(certs);
        EVP_PKEY_free(local_198);
        goto LAB_00103bb1;
      }
      pcVar11 = "-e option cannot be used for server\n";
    }
    else {
      pcVar11 = "-s option cannot be used for server\n";
    }
    sStack_1c0 = 0x24;
  }
LAB_00103cdd:
  fwrite(pcVar11,sStack_1c0,1,_stderr);
  return 1;
}

Assistant:

int main(int argc, char **argv)
{
    ERR_load_crypto_strings();
    OpenSSL_add_all_algorithms();
#if !defined(OPENSSL_NO_ENGINE)
    /* Load all compiled-in ENGINEs */
    ENGINE_load_builtin_engines();
    ENGINE_register_all_ciphers();
    ENGINE_register_all_digests();
#endif

    ptls_openssl_lookup_certificate_t lookup_certificate;
    ptls_encrypt_ticket_t encrypt_ticket = {encrypt_ticket_cb}, decrypt_ticket = {decrypt_ticket_cb};
    ptls_save_ticket_t save_ticket = {save_ticket_cb};
    ptls_context_t ctx = {ptls_openssl_random_bytes,
                          ptls_openssl_key_exchanges,
                          ptls_openssl_cipher_suites,
                          &lookup_certificate.super,
                          NULL,
                          86400,
                          8192,
                          0,
                          &encrypt_ticket,
                          &decrypt_ticket,
                          &save_ticket};
    ptls_openssl_verify_certificate_t verify_certificate = {{NULL}};
    ptls_handshake_properties_t hsprop = {{{NULL}}};
    const char *host, *port;
    STACK_OF(X509) *certs = NULL;
    EVP_PKEY *pkey = NULL;
    int use_early_data = 0, ch;
    struct sockaddr_storage sa;
    socklen_t salen;

    ptls_openssl_init_lookup_certificate(&lookup_certificate);

    while ((ch = getopt(argc, argv, "c:k:es:vh")) != -1) {
        switch (ch) {
        case 'c': {
            FILE *fp;
            X509 *cert;
            if ((fp = fopen(optarg, "rb")) == NULL) {
                fprintf(stderr, "failed to open file:%s:%s\n", optarg, strerror(errno));
                return 1;
            }
            certs = sk_X509_new(NULL);
            while ((cert = PEM_read_X509(fp, NULL, NULL, NULL)) != NULL)
                sk_X509_push(certs, cert);
            fclose(fp);
            if (sk_X509_num(certs) == 0) {
                fprintf(stderr, "failed to load certificate chain from file:%s\n", optarg);
                return 1;
            }
        } break;
        case 'k': {
            FILE *fp;
            if ((fp = fopen(optarg, "rb")) == NULL) {
                fprintf(stderr, "failed to open file:%s:%s\n", optarg, strerror(errno));
                return 1;
            }
            pkey = PEM_read_PrivateKey(fp, NULL, NULL, NULL);
            fclose(fp);
            if (pkey == NULL) {
                fprintf(stderr, "failed to load private key from file:%s\n", optarg);
                return 1;
            }
        } break;
        case 'e':
            use_early_data = 1;
            break;
        case 's':
            session_file = optarg;
            break;
        case 'v':
            ptls_openssl_init_verify_certificate(&verify_certificate, NULL);
            break;
        default:
            usage(argv[0]);
            exit(1);
        }
    }
    argc -= optind;
    argv += optind;
    if (certs != NULL || pkey != NULL) {
        /* server */
        if (certs == NULL || pkey == NULL) {
            fprintf(stderr, "-c and -k options must be used together\n");
            return 1;
        }
        if (session_file != NULL) {
            fprintf(stderr, "-s option cannot be used for server\n");
            return 1;
        }
        if (use_early_data) {
            fprintf(stderr, "-e option cannot be used for server\n");
            return 1;
        }
        ptls_openssl_lookup_certificate_add_identity(&lookup_certificate, "example.com", pkey, certs);
        sk_X509_free(certs);
        EVP_PKEY_free(pkey);
    } else {
        /* client */
        if (session_file != NULL) {
            ptls_buffer_t sessdata;
            ptls_buffer_init(&sessdata, "", 0);
            if (load_ticket(&sessdata) == 0)
                hsprop.client.session_ticket = ptls_iovec_init(sessdata.base, sessdata.off);
        }
        if (use_early_data) {
            static size_t max_early_data_size;
            hsprop.client.max_early_data_size = &max_early_data_size;
        }
    }
    if (verify_certificate.super.cb == NULL)
        ptls_openssl_init_verify_certificate(&verify_certificate, NULL);
    ctx.verify_certificate = &verify_certificate.super;
    if (argc != 2) {
        fprintf(stderr, "missing host and port\n");
        return 1;
    }
    host = (--argc, *argv++);
    port = (--argc, *argv++);

    if (resolve_address((struct sockaddr *)&sa, &salen, host, port) != 0)
        exit(1);

    return (certs != NULL ? run_server : run_client)((struct sockaddr *)&sa, salen, &ctx, &hsprop);
}